

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateVPTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_4::ViewportArrayTestInstance::initPipeline
          (ViewportArrayTestInstance *this,VkDevice device)

{
  DeviceInterface *pDVar1;
  StencilOpState _front;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)14>_> data_01;
  RefData<vk::Handle<(vk::HandleType)18>_> data_02;
  StencilOpState _back;
  VkAllocationCallbacks *pVVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  ProgramBinary *pPVar4;
  Handle<(vk::HandleType)16> *pHVar5;
  Handle<(vk::HandleType)17> *pHVar6;
  Handle<(vk::HandleType)14> *pHVar7;
  VkPipelineCache local_838;
  Move<vk::Handle<(vk::HandleType)18>_> local_830;
  RefData<vk::Handle<(vk::HandleType)18>_> local_810;
  allocator<vk::VkDynamicState> local_7e9;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_7e8;
  DynamicState local_7d0;
  allocator<unsigned_int> local_795;
  value_type_conflict2 local_794;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_790;
  MultiSampleState local_778;
  VkPipelineRasterizationStateCreateInfo local_730;
  VkStencilOpState local_6f0;
  VkStencilOpState local_6d0;
  VkPipelineDepthStencilStateCreateInfo local_6b0;
  allocator<vk::VkRect2D> local_641;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_640;
  allocator<vk::VkViewport> local_621;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_620;
  ViewportState local_608;
  ColorBlendState local_5a8;
  VkPipelineInputAssemblyStateCreateInfo local_558;
  VkPipelineVertexInputStateCreateInfo local_538;
  deUint64 local_508;
  VkPipelineShaderStageCreateInfo local_500;
  deUint64 local_4d0;
  VkPipelineShaderStageCreateInfo local_4c8;
  deUint64 local_498;
  VkPipelineShaderStageCreateInfo local_490;
  deUint64 local_460;
  VkPipelineLayout local_458;
  undefined1 local_450 [8];
  PipelineCreateInfo pipelineCreateInfo;
  Attachment vkCbAttachmentState;
  RefData<vk::Handle<(vk::HandleType)14>_> local_128;
  undefined1 local_108 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fs;
  RefData<vk::Handle<(vk::HandleType)14>_> local_c8;
  undefined1 local_a8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> gs;
  Move<vk::Handle<(vk::HandleType)14>_> local_78;
  RefData<vk::Handle<(vk::HandleType)14>_> local_58;
  undefined1 local_38 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vs;
  VkDevice device_local;
  ViewportArrayTestInstance *this_local;
  
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)device;
  pPVar3 = Context::getBinaryCollection
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar3,&(this->super_DynamicStateBaseClass).m_vertexShaderName);
  ::vk::createShaderModule(&local_78,pDVar1,device,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data.deleter.m_deviceIface._0_4_ = (int)local_58.deleter.m_deviceIface;
  data.object.m_internal = local_58.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_58.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_58.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_58.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_58.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_58.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_38,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_78);
  pVVar2 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  pPVar3 = Context::getBinaryCollection
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&this->m_geometryShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,pDVar1,
             (VkDevice)pVVar2,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_c8,
             (Move *)&fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator);
  pVVar2 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  pPVar3 = Context::getBinaryCollection
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar3,&(this->super_DynamicStateBaseClass).m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp,pDVar1,
             (VkDevice)pVVar2,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_128,
             (Move *)&vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_128.deleter.m_deviceIface;
  data_01.object.m_internal = local_128.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_128.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_128.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_128.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_128.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_128.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_108,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp);
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            ((Attachment *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,VK_BLEND_FACTOR_SRC_COLOR,
             VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_COLOR,
             VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->super_DynamicStateBaseClass).m_pipelineLayout.
                       super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_458.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->super_DynamicStateBaseClass).m_renderPass.
                       super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_460 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)local_450,local_458,(VkRenderPass)local_460,0,0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_38);
  local_498 = pHVar7->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_490,(VkShaderModule)local_498,"main",
             VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_450,&local_490);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_a8);
  local_4d0 = pHVar7->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_4c8,(VkShaderModule)local_4d0,"main",
             VK_SHADER_STAGE_GEOMETRY_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_450,&local_4c8);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_108);
  local_508 = pHVar7->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_500,(VkShaderModule)local_508,"main",
             VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_450,&local_500);
  local_538.sType =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.sType;
  local_538._4_4_ =
       *(undefined4 *)
        &(this->super_DynamicStateBaseClass).m_vertexInputState.
         super_VkPipelineVertexInputStateCreateInfo.field_0x4;
  local_538.pNext =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_538.flags =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.flags;
  local_538.vertexBindingDescriptionCount =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.vertexBindingDescriptionCount;
  local_538.pVertexBindingDescriptions =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions;
  local_538.vertexAttributeDescriptionCount =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.vertexAttributeDescriptionCount;
  local_538._36_4_ =
       *(undefined4 *)
        &(this->super_DynamicStateBaseClass).m_vertexInputState.
         super_VkPipelineVertexInputStateCreateInfo.field_0x24;
  local_538.pVertexAttributeDescriptions =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions;
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_450,&local_538);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_558,(this->super_DynamicStateBaseClass).m_topology,0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_450,&local_558);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            (&local_5a8,1,
             (VkPipelineColorBlendAttachmentState *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_450,&local_5a8.super_VkPipelineColorBlendStateCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::~ColorBlendState(&local_5a8);
  std::allocator<vk::VkViewport>::allocator(&local_621);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector(&local_620,0,&local_621);
  std::allocator<vk::VkRect2D>::allocator(&local_641);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector(&local_640,0,&local_641);
  Draw::PipelineCreateInfo::ViewportState::ViewportState(&local_608,4,&local_620,&local_640);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_450,&local_608.super_VkPipelineViewportStateCreateInfo);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState(&local_608);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_640);
  std::allocator<vk::VkRect2D>::~allocator(&local_641);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_620);
  std::allocator<vk::VkViewport>::~allocator(&local_621);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_6d0,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_6f0,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_6d0.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_6d0.failOp;
  _front.super_VkStencilOpState.passOp = local_6d0.passOp;
  _front.super_VkStencilOpState.compareOp = local_6d0.compareOp;
  _front.super_VkStencilOpState.compareMask = local_6d0.compareMask;
  _front.super_VkStencilOpState.writeMask = local_6d0.writeMask;
  _front.super_VkStencilOpState.reference = local_6d0.reference;
  _back.super_VkStencilOpState.depthFailOp = local_6f0.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_6f0.failOp;
  _back.super_VkStencilOpState.passOp = local_6f0.passOp;
  _back.super_VkStencilOpState.compareOp = local_6f0.compareOp;
  _back.super_VkStencilOpState.compareMask = local_6f0.compareMask;
  _back.super_VkStencilOpState.writeMask = local_6f0.writeMask;
  _back.super_VkStencilOpState.reference = local_6f0.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&local_6b0,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_450,&local_6b0);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_730,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_450,&local_730);
  local_794 = 0xffffffff;
  std::allocator<unsigned_int>::allocator(&local_795);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_790,1,&local_794,&local_795);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            (&local_778,VK_SAMPLE_COUNT_1_BIT,0,0.0,&local_790,false,false);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_450,&local_778.super_VkPipelineMultisampleStateCreateInfo);
  Draw::PipelineCreateInfo::MultiSampleState::~MultiSampleState(&local_778);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_790);
  std::allocator<unsigned_int>::~allocator(&local_795);
  std::allocator<vk::VkDynamicState>::allocator(&local_7e9);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::vector
            (&local_7e8,0,&local_7e9);
  Draw::PipelineCreateInfo::DynamicState::DynamicState(&local_7d0,&local_7e8);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_450,&local_7d0.super_VkPipelineDynamicStateCreateInfo);
  Draw::PipelineCreateInfo::DynamicState::~DynamicState(&local_7d0);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~vector(&local_7e8);
  std::allocator<vk::VkDynamicState>::~allocator(&local_7e9);
  pVVar2 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_838,0);
  ::vk::createGraphicsPipeline
            (&local_830,pDVar1,(VkDevice)pVVar2,local_838,(VkGraphicsPipelineCreateInfo *)local_450,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_810,(Move *)&local_830);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_810.deleter.m_deviceIface;
  data_02.object.m_internal = local_810.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_810.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_810.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_810.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_810.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_810.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
            (&(this->super_DynamicStateBaseClass).m_pipeline,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_830);
  Draw::PipelineCreateInfo::~PipelineCreateInfo((PipelineCreateInfo *)local_450);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_108);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_38);
  return;
}

Assistant:

virtual void initPipeline (const vk::VkDevice device)
	{
		const vk::Unique<vk::VkShaderModule> vs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
		const vk::Unique<vk::VkShaderModule> gs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_geometryShaderName), 0));
		const vk::Unique<vk::VkShaderModule> fs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

		const PipelineCreateInfo::ColorBlendState::Attachment vkCbAttachmentState;

		PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*gs, "main", vk::VK_SHADER_STAGE_GEOMETRY_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
		pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
		pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
		pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &vkCbAttachmentState));
		pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(4));
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());
		pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
		pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
		pipelineCreateInfo.addState(PipelineCreateInfo::DynamicState());

		m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);
	}